

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O0

void trt_pose::parse::assignment_out_k
               (int *connections,float *score_graph,int *topology,int *counts,int K,int M,
               float score_threshold,void *workspace)

{
  int count_b;
  int count_a;
  int cmap_idx_b;
  int cmap_idx_a;
  int *tk;
  int k;
  float score_threshold_local;
  int M_local;
  int K_local;
  int *counts_local;
  int *topology_local;
  float *score_graph_local;
  int *connections_local;
  
  for (tk._0_4_ = 0; (int)tk < K; tk._0_4_ = (int)tk + 1) {
    assignment_out(connections + (int)tk * 2 * M,score_graph + (int)tk * M * M,
                   counts[topology[(long)((int)tk << 2) + 2]],
                   counts[topology[(long)((int)tk << 2) + 3]],M,score_threshold,workspace);
  }
  return;
}

Assistant:

void assignment_out_k(int *connections,         // Kx2xM
                      const float *score_graph, // KxMxM
                      const int *topology,      // Kx4
                      const int *counts,        // C
                      const int K, const int M, const float score_threshold,
                      void *workspace) {
  for (int k = 0; k < K; k++) {
    const int *tk = &topology[k * 4];
    const int cmap_idx_a = tk[2];
    const int cmap_idx_b = tk[3];
    const int count_a = counts[cmap_idx_a];
    const int count_b = counts[cmap_idx_b];
    assignment_out(&connections[k * 2 * M], &score_graph[k * M * M], count_a,
                   count_b, M, score_threshold, workspace);
  }
}